

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SleepCommand.h
# Opt level: O3

void __thiscall SleepCommand::~SleepCommand(SleepCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001168d0;
  pcVar2 = (this->time_to_sleep_string)._M_dataplus._M_p;
  paVar1 = &(this->time_to_sleep_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~SleepCommand() override = default;